

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void cache_features(io_buf *cache,example *ae,uint64_t mask)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *__src;
  byte *pbVar3;
  size_t *psVar4;
  byte *pbVar5;
  size_t __n;
  char *c;
  size_t *local_38;
  
  __src = (ae->tag)._begin;
  __n = (long)(ae->tag)._end - (long)__src;
  io_buf::buf_write(cache,(char **)&local_38,__n + 8);
  psVar4 = local_38;
  *local_38 = __n;
  local_38 = local_38 + 1;
  memcpy(local_38,__src,__n);
  local_38 = (size_t *)((long)psVar4 + __n + 8);
  cache->head = (char *)local_38;
  uVar1 = *(undefined4 *)&(ae->super_example_predict).indices._end;
  uVar2 = *(undefined4 *)&(ae->super_example_predict).indices._begin;
  io_buf::buf_write(cache,(char **)&local_38,1);
  *(char *)local_38 = (char)uVar1 - (char)uVar2;
  cache->head = (char *)((long)local_38 + 1);
  pbVar3 = (ae->super_example_predict).indices._end;
  local_38 = (size_t *)((long)local_38 + 1);
  for (pbVar5 = (ae->super_example_predict).indices._begin; pbVar5 != pbVar3; pbVar5 = pbVar5 + 1) {
    output_features(cache,*pbVar5,(ae->super_example_predict).feature_space + *pbVar5,mask);
  }
  return;
}

Assistant:

void cache_features(io_buf& cache, example* ae, uint64_t mask)
{
  cache_tag(cache, ae->tag);
  output_byte(cache, (unsigned char)ae->indices.size());

  for (namespace_index ns : ae->indices) output_features(cache, ns, ae->feature_space[ns], mask);
}